

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

type_conflict1 __thiscall
llvm::StringRef::getAsInteger<unsigned_int>(StringRef *this,uint Radix,uint *Result)

{
  bool bVar1;
  unsigned_long_long *in_R8;
  StringRef Str;
  ulong local_30;
  unsigned_long_long ULLVal;
  uint *Result_local;
  StringRef *pSStack_18;
  uint Radix_local;
  StringRef *this_local;
  
  Str.Length._0_4_ = Radix;
  Str.Data = (char *)this->Length;
  Str.Length._4_4_ = 0;
  ULLVal = (unsigned_long_long)Result;
  Result_local._4_4_ = Radix;
  pSStack_18 = this;
  bVar1 = getAsUnsignedInteger((llvm *)this->Data,Str,(uint)&local_30,in_R8);
  if ((bVar1) || ((local_30 & 0xffffffff) != local_30)) {
    this_local._7_1_ = true;
  }
  else {
    *(int *)ULLVal = (int)local_30;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

typename std::enable_if<!std::numeric_limits<T>::is_signed, bool>::type
    getAsInteger(unsigned Radix, T &Result) const {
      unsigned long long ULLVal;
      // The additional cast to unsigned long long is required to avoid the
      // Visual C++ warning C4805: '!=' : unsafe mix of type 'bool' and type
      // 'unsigned __int64' when instantiating getAsInteger with T = bool.
      if (getAsUnsignedInteger(*this, Radix, ULLVal) ||
          static_cast<unsigned long long>(static_cast<T>(ULLVal)) != ULLVal)
        return true;
      Result = ULLVal;
      return false;
    }